

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

_Bool borg_flow_old(wchar_t why)

{
  loc grid1;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  loc grid2;
  int local_2c;
  wchar_t b_c;
  wchar_t c;
  wchar_t b_i;
  wchar_t i;
  wchar_t b_n;
  wchar_t y;
  wchar_t x;
  wchar_t why_local;
  
  if (borg.goal.type == why) {
    b_i = L'\0';
    b_c = L'\xffffffff';
    local_2c = (uint)borg_data_flow->data[borg.c.y][borg.c.x] * 10 + -5;
    for (c = L'\0'; c < L'\b'; c = c + L'\x01') {
      iVar2 = borg.c.x + ddx_ddd[c];
      iVar3 = borg.c.y + ddy_ddd[c];
      iVar4 = (uint)borg_data_flow->data[iVar3][iVar2] * 10;
      if ((((iVar4 <= local_2c) && (iVar2 < 0xc6)) && (0 < iVar2)) &&
         ((iVar3 < 0x42 && (0 < iVar3)))) {
        if (iVar4 < local_2c) {
          b_i = L'\0';
        }
        if ((((borg.trait[0x69] != 0) || (b_i = b_i + L'\x01', b_i < L'\x02')) ||
            (uVar5 = Rand_div(b_i), uVar5 == 0)) &&
           ((borg.trait[0x69] < 1 || (b_i = b_i + L'\x01', b_i < L'\x02')))) {
          if ((borg.goal.type == 10) && ((ddx_ddd[c] == 0 || (ddy_ddd[c] == 0)))) {
            grid2 = loc((uint)borg_flow_x[0],(uint)borg_flow_y[0]);
            grid1.y = borg.c.y;
            grid1.x = borg.c.x;
            wVar6 = distance(grid1,grid2);
            if (wVar6 < L'\x03') goto LAB_002a2fb5;
          }
          b_c = c;
          local_2c = iVar4;
        }
      }
LAB_002a2fb5:
    }
    if ((L'\xffffffff' < b_c) &&
       (_Var1 = borg_play_step(borg.c.y + ddy_ddd[b_c],borg.c.x + ddx_ddd[b_c]), _Var1)) {
      return true;
    }
    if (((borg.goal.type == 10) && (borg.c.y == (uint)borg_flow_y[0])) &&
       (borg.c.x == (uint)borg_flow_x[0])) {
      borg_t_antisummon = (wchar_t)borg_t;
    }
    borg.goal.type = 0;
  }
  return false;
}

Assistant:

bool borg_flow_old(int why)
{
    int x, y;

    /* Continue */
    if (borg.goal.type == why) {
        int b_n = 0;

        int i, b_i = -1;

        int c, b_c;

        /* Flow cost of current grid */
        b_c = borg_data_flow->data[borg.c.y][borg.c.x] * 10;

        /* Prevent loops */
        b_c = b_c - 5;

        /* Look around */
        for (i = 0; i < 8; i++) {
            /* Grid in that direction */
            x = borg.c.x + ddx_ddd[i];
            y = borg.c.y + ddy_ddd[i];

            /* Flow cost at that grid */
            c = borg_data_flow->data[y][x] * 10;

            /* Never backtrack */
            if (c > b_c)
                continue;

            /* avoid screen edges */
            if (x > AUTO_MAX_X - 1 || x < 1 || y > AUTO_MAX_Y - 1 || y < 1)
                continue;

            /* Notice new best value */
            if (c < b_c)
                b_n = 0;

            /* Apply the randomizer to equivalent values */
            if (borg.trait[BI_CDEPTH] == 0 && (++b_n >= 2)
                && (randint0(b_n) != 0))
                continue;
            else if (borg.trait[BI_CDEPTH] >= 1 && ++b_n >= 2)
                continue;

            /* Special case when digging anti-summon corridor */
            if (borg.goal.type == GOAL_DIGGING
                && (ddx_ddd[i] == 0 || ddy_ddd[i] == 0)) {
                /* No straight lines */
                if (distance(borg.c, loc(borg_flow_x[0], borg_flow_y[0])) <= 2)
                    continue;
            }

            /* Track it */
            b_i = i;
            b_c = c;
        }

        /* Try it */
        if (b_i >= 0) {
            /* Access the location */
            x = borg.c.x + ddx_ddd[b_i];
            y = borg.c.y + ddy_ddd[b_i];

            /* Attempt motion */
            if (borg_play_step(y, x))
                return true;
        }

        /* Mark a timestamp to wait on a anti-summon spot for a few turns */
        if (borg.goal.type == GOAL_DIGGING && borg.c.y == borg_flow_y[0]
            && borg.c.x == borg_flow_x[0])
            borg_t_antisummon = borg_t;

        /* Cancel goal */
        borg.goal.type = 0;
    }

    /* Nothing to do */
    return false;
}